

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O2

TextureBindingSp __thiscall
vkt::sr::anon_unknown_0::TextureGather2DArrayInstance::createTexture
          (TextureGather2DArrayInstance *this)

{
  Texture2DArray *this_00;
  ostringstream *this_01;
  TestLog *pTVar1;
  pointer pPVar2;
  pointer pPVar3;
  long lVar4;
  uint seed;
  Texture2DArray *pTVar5;
  TextureBinding *this_02;
  size_t __n;
  ConstPixelBufferAccess *access;
  void *__buf;
  void *__buf_00;
  SharedPtrStateBase *extraout_RDX;
  long lVar6;
  long in_RSI;
  int levelNdx;
  long lVar7;
  PixelBufferAccess *dst;
  long lVar8;
  TextureBindingSp TVar9;
  int local_370;
  int local_36c;
  long local_368;
  TestLog *local_360;
  MovePtr<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> texture;
  int local_340;
  ConstPixelBufferAccess local_338;
  Sampler local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  TextureFormatInfo texFmtInfo;
  MessageBuilder local_1b0;
  
  pTVar1 = *(TestLog **)(**(long **)(in_RSI + 8) + 0x10);
  tcu::getTextureFormatInfo(&texFmtInfo,(TextureFormat *)(in_RSI + 0x218));
  pTVar5 = (Texture2DArray *)operator_new(0x58);
  tcu::Texture2DArray::Texture2DArray
            (pTVar5,(TextureFormat *)(in_RSI + 0x218),*(int *)(in_RSI + 0x264),
             *(int *)(in_RSI + 0x268),*(int *)(in_RSI + 0x26c));
  local_310.compare = *(CompareMode *)(in_RSI + 0x220);
  local_310._0_8_ = *(undefined8 *)(in_RSI + 0x224);
  local_310.wrapR = REPEAT_GL;
  local_310._12_8_ = *(undefined8 *)(in_RSI + 0x240);
  local_310.lodThreshold = 0.0;
  local_310.normalizedCoords = true;
  local_310.depthStencilMode = MODE_DEPTH;
  local_310._32_8_ = 0;
  local_310.borderColor.v._4_5_ = 0;
  local_310.borderColor.v.uData[2]._1_3_ = 0;
  local_310._48_5_ = 0;
  pPVar2 = (pTVar5->super_TextureLevelPyramid).m_access.
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pPVar3 = (pTVar5->super_TextureLevelPyramid).m_access.
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_368 = in_RSI;
  local_360 = pTVar1;
  texture.super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.m_data.ptr
       = pTVar5;
  for (local_36c = *(int *)(in_RSI + 0x248);
      pTVar5 = texture.
               super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.
               m_data.ptr, local_340 = (int)(((long)pPVar2 - (long)pPVar3) / 0x28),
      local_36c < local_340; local_36c = local_36c + 1) {
    tcu::Texture2DArray::allocLevel
              (texture.
               super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.
               m_data.ptr,local_36c);
    dst = ((texture.super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.
            m_data.ptr)->super_TextureLevelPyramid).m_access.
          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
          _M_impl.super__Vector_impl_data._M_start + local_36c;
    seed = tcu::CommandLine::getBaseSeed(*(CommandLine **)(**(long **)(local_368 + 8) + 0x18));
    __n = (size_t)seed;
    fillWithRandomColorTiles(dst,&texFmtInfo.valueMin,&texFmtInfo.valueMax,seed);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,"InputTextureLevel",(allocator<char> *)&local_2b0);
    de::toString<int>(&local_230,&local_36c);
    std::operator+(&local_210,"Input texture, level ",&local_230);
    tcu::LogImageSet::LogImageSet((LogImageSet *)&local_1b0,(string *)&local_338,&local_210);
    tcu::LogImageSet::write((LogImageSet *)&local_1b0,(int)local_360,__buf,__n);
    tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_338);
    for (local_370 = 0; pTVar1 = local_360, local_370 < *(int *)(local_368 + 0x26c);
        local_370 = local_370 + 1) {
      de::toString<int>(&local_250,&local_370);
      std::operator+(&local_2b0,"InputTextureLevel",&local_250);
      std::operator+(&local_230,&local_2b0,"Layer");
      de::toString<int>(&local_270,&local_370);
      std::operator+(&local_210,&local_230,&local_270);
      de::toString<int>(&local_290,&local_370);
      std::operator+(&local_2d0,"Layer ",&local_290);
      access = &local_338;
      tcu::getSubregion((PixelBufferAccess *)access,dst,0,0,local_370,
                        (dst->super_ConstPixelBufferAccess).m_size.m_data[0],
                        (dst->super_ConstPixelBufferAccess).m_size.m_data[1],1);
      tcu::LogImage::LogImage
                ((LogImage *)&local_1b0,&local_210,&local_2d0,access,QP_IMAGE_COMPRESSION_MODE_BEST)
      ;
      tcu::LogImage::write((LogImage *)&local_1b0,(int)local_360,__buf_00,(size_t)access);
      tcu::LogImage::~LogImage((LogImage *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_250);
    }
    tcu::TestLog::endImageSet(local_360);
    this_01 = &local_1b0.m_str;
    local_1b0.m_log = pTVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
    std::operator<<((ostream *)this_01,"Note: texture level\'s size is ");
    local_338.m_size.m_data[0] = (dst->super_ConstPixelBufferAccess).m_size.m_data[2];
    local_338.m_format.order = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
    local_338.m_format.type = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
    tcu::operator<<((ostream *)this_01,(Vector<int,_3> *)&local_338);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
  }
  tcu::Texture2DArray::Texture2DArray
            ((Texture2DArray *)&local_1b0,
             (TextureFormat *)
             texture.super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>
             .m_data.ptr,
             (texture.
              super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.m_data
             .ptr)->m_width,
             (texture.
              super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.m_data
             .ptr)->m_height,
             (texture.
              super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.m_data
             .ptr)->m_numLayers);
  lVar4 = local_368;
  this_00 = (Texture2DArray *)(local_368 + 0x288);
  tcu::Texture2DArray::operator=(this_00,(Texture2DArray *)&local_1b0);
  tcu::Texture3D::~Texture3D((Texture3D *)&local_1b0);
  lVar8 = 8;
  lVar6 = 0;
  for (lVar7 = 0;
      lVar7 < (int)(((long)(pTVar5->super_TextureLevelPyramid).m_access.
                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pTVar5->super_TextureLevelPyramid).m_access.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x28); lVar7 = lVar7 + 1) {
    if (*(long *)((long)&((pTVar5->super_TextureLevelPyramid).m_data.
                          super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar8) != 0) {
      tcu::Texture2DArray::allocLevel(this_00,(int)lVar7);
      swizzlePixels((PixelBufferAccess *)(*(long *)(local_368 + 0x2a8) + lVar6),
                    (ConstPixelBufferAccess *)
                    ((long)(((pTVar5->super_TextureLevelPyramid).m_access.
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_ConstPixelBufferAccess).m_size.m_data + lVar6 + -8),
                    (MaybeTextureSwizzle *)(lVar4 + 0x22c));
    }
    lVar6 = lVar6 + 0x28;
    lVar8 = lVar8 + 0x10;
  }
  this_02 = (TextureBinding *)operator_new(0x68);
  pTVar5 = texture.super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.
           m_data.ptr;
  texture.super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.m_data.ptr
       = (Texture2DArray *)0x0;
  TextureBinding::TextureBinding(this_02,pTVar5,&local_310);
  de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr
            ((SharedPtr<vkt::sr::TextureBinding> *)this,this_02);
  de::details::UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>::
  ~UniqueBase(&texture.
               super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>);
  TVar9.m_state = extraout_RDX;
  TVar9.m_ptr = (TextureBinding *)this;
  return TVar9;
}

Assistant:

TextureBindingSp TextureGather2DArrayInstance::createTexture (void)
{
	TestLog&						log			= m_context.getTestContext().getLog();
	const tcu::TextureFormatInfo	texFmtInfo	= tcu::getTextureFormatInfo(m_baseParams.textureFormat);
	MovePtr<tcu::Texture2DArray>	texture		= MovePtr<tcu::Texture2DArray>(new tcu::Texture2DArray(m_baseParams.textureFormat, m_textureSize.x(), m_textureSize.y(), m_textureSize.z()));
	const tcu::Sampler				sampler		(m_baseParams.wrapS, m_baseParams.wrapT, tcu::Sampler::REPEAT_GL,
												 m_baseParams.minFilter, m_baseParams.magFilter,
												 0.0f /* LOD threshold */, true /* normalized coords */, m_baseParams.shadowCompareMode);

	{
		const int	levelBegin	= m_baseParams.baseLevel;
		const int	levelEnd	= texture->getNumLevels();
		DE_ASSERT(m_baseParams.baseLevel < texture->getNumLevels());

		for (int levelNdx = levelBegin; levelNdx < levelEnd; levelNdx++)
		{
			texture->allocLevel(levelNdx);
			const PixelBufferAccess& level = texture->getLevel(levelNdx);
			fillWithRandomColorTiles(level, texFmtInfo.valueMin, texFmtInfo.valueMax, (deUint32)m_context.getTestContext().getCommandLine().getBaseSeed());

			log << TestLog::ImageSet("InputTextureLevel", "Input texture, level " + de::toString(levelNdx));
			for (int layerNdx = 0; layerNdx < m_textureSize.z(); layerNdx++)
				log << TestLog::Image("InputTextureLevel" + de::toString(layerNdx) + "Layer" + de::toString(layerNdx),
									  "Layer " + de::toString(layerNdx),
									  tcu::getSubregion(level, 0, 0, layerNdx, level.getWidth(), level.getHeight(), 1));
			log << TestLog::EndImageSet
				<< TestLog::Message << "Note: texture level's size is " << IVec3(level.getWidth(), level.getHeight(), level.getDepth()) << TestLog::EndMessage;
		}

		swizzleTexture(m_swizzledTexture, *texture, m_baseParams.textureSwizzle);
	}

	return TextureBindingSp(new TextureBinding(texture.release(), sampler));
}